

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O0

string_view mime_type(string_view path)

{
  string_view lhs;
  string_view lhs_00;
  string_view lhs_01;
  string_view lhs_02;
  string_view lhs_03;
  string_view lhs_04;
  string_view lhs_05;
  string_view lhs_06;
  string_view lhs_07;
  string_view lhs_08;
  string_view lhs_09;
  string_view lhs_10;
  string_view lhs_11;
  string_view lhs_12;
  string_view lhs_13;
  string_view lhs_14;
  string_view lhs_15;
  string_view lhs_16;
  string_view lhs_17;
  string_view lhs_18;
  string_view lhs_19;
  bool bVar1;
  string_view local_2e0;
  char *local_2d0;
  char *local_2c8;
  string_view local_2c0;
  char *local_2b0;
  char *local_2a8;
  string_view local_2a0;
  char *local_290;
  char *local_288;
  string_view local_280;
  char *local_270;
  char *local_268;
  string_view local_260;
  char *local_250;
  char *local_248;
  string_view local_240;
  char *local_230;
  char *local_228;
  string_view local_220;
  char *local_210;
  char *local_208;
  string_view local_200;
  char *local_1f0;
  char *local_1e8;
  string_view local_1e0;
  char *local_1d0;
  char *local_1c8;
  string_view local_1c0;
  char *local_1b0;
  char *local_1a8;
  string_view local_1a0;
  char *local_190;
  char *local_188;
  string_view local_180;
  char *local_170;
  char *local_168;
  string_view local_160;
  char *local_150;
  char *local_148;
  string_view local_140;
  char *local_130;
  char *local_128;
  string_view local_120;
  char *local_110;
  char *local_108;
  string_view local_100;
  char *local_f0;
  char *local_e8;
  string_view local_e0;
  char *local_d0;
  char *local_c8;
  string_view local_c0;
  char *local_b0;
  char *local_a8;
  string_view local_a0;
  char *local_90;
  char *local_88;
  string_view local_80;
  char *local_70;
  char *local_68;
  string_view local_60;
  char *local_50;
  char *local_48;
  anon_class_8_1_89901123 local_40;
  undefined1 local_38 [8];
  string_view ext;
  string_view path_local;
  
  path_local.ptr_ = (char *)path.len_;
  ext.len_ = (size_t)path.ptr_;
  local_40.path = (string_view *)&ext.len_;
  _local_38 = mime_type::anon_class_8_1_89901123::operator()(&local_40);
  local_50 = (char *)local_38;
  local_48 = ext.ptr_;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,".htm");
  lhs_19.len_ = (size_t)local_48;
  lhs_19.ptr_ = local_50;
  bVar1 = boost::beast::iequals(lhs_19,local_60);
  if (bVar1) {
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,"text/html");
  }
  else {
    local_70 = (char *)local_38;
    local_68 = ext.ptr_;
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,".html");
    lhs_18.len_ = (size_t)local_68;
    lhs_18.ptr_ = local_70;
    bVar1 = boost::beast::iequals(lhs_18,local_80);
    if (bVar1) {
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,"text/html");
    }
    else {
      local_90 = (char *)local_38;
      local_88 = ext.ptr_;
      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,".php");
      lhs_17.len_ = (size_t)local_88;
      lhs_17.ptr_ = local_90;
      bVar1 = boost::beast::iequals(lhs_17,local_a0);
      if (bVar1) {
        boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,"text/html")
        ;
      }
      else {
        local_b0 = (char *)local_38;
        local_a8 = ext.ptr_;
        boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,".css")
        ;
        lhs_16.len_ = (size_t)local_a8;
        lhs_16.ptr_ = local_b0;
        bVar1 = boost::beast::iequals(lhs_16,local_c0);
        if (bVar1) {
          boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,"text/css"
                    );
        }
        else {
          local_d0 = (char *)local_38;
          local_c8 = ext.ptr_;
          boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_e0,".txt");
          lhs_15.len_ = (size_t)local_c8;
          lhs_15.ptr_ = local_d0;
          bVar1 = boost::beast::iequals(lhs_15,local_e0);
          if (bVar1) {
            boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,
                       "text/plain");
          }
          else {
            local_f0 = (char *)local_38;
            local_e8 = ext.ptr_;
            boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_100,".js");
            lhs_14.len_ = (size_t)local_e8;
            lhs_14.ptr_ = local_f0;
            bVar1 = boost::beast::iequals(lhs_14,local_100);
            if (bVar1) {
              boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,
                         "application/javascript");
            }
            else {
              local_110 = (char *)local_38;
              local_108 = ext.ptr_;
              boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_120,".json");
              lhs_13.len_ = (size_t)local_108;
              lhs_13.ptr_ = local_110;
              bVar1 = boost::beast::iequals(lhs_13,local_120);
              if (bVar1) {
                boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,
                           "application/json");
              }
              else {
                local_130 = (char *)local_38;
                local_128 = ext.ptr_;
                boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_140,".xml");
                lhs_12.len_ = (size_t)local_128;
                lhs_12.ptr_ = local_130;
                bVar1 = boost::beast::iequals(lhs_12,local_140);
                if (bVar1) {
                  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,
                             "application/xml");
                }
                else {
                  local_150 = (char *)local_38;
                  local_148 = ext.ptr_;
                  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_160,".swf");
                  lhs_11.len_ = (size_t)local_148;
                  lhs_11.ptr_ = local_150;
                  bVar1 = boost::beast::iequals(lhs_11,local_160);
                  if (bVar1) {
                    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)&path_local.len_,
                               "application/x-shockwave-flash");
                  }
                  else {
                    local_170 = (char *)local_38;
                    local_168 = ext.ptr_;
                    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_180,".flv");
                    lhs_10.len_ = (size_t)local_168;
                    lhs_10.ptr_ = local_170;
                    bVar1 = boost::beast::iequals(lhs_10,local_180);
                    if (bVar1) {
                      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &path_local.len_,"video/x-flv");
                    }
                    else {
                      local_190 = (char *)local_38;
                      local_188 = ext.ptr_;
                      boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (&local_1a0,".png");
                      lhs_09.len_ = (size_t)local_188;
                      lhs_09.ptr_ = local_190;
                      bVar1 = boost::beast::iequals(lhs_09,local_1a0);
                      if (bVar1) {
                        boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   &path_local.len_,"image/png");
                      }
                      else {
                        local_1b0 = (char *)local_38;
                        local_1a8 = ext.ptr_;
                        boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  (&local_1c0,".jpe");
                        lhs_08.len_ = (size_t)local_1a8;
                        lhs_08.ptr_ = local_1b0;
                        bVar1 = boost::beast::iequals(lhs_08,local_1c0);
                        if (bVar1) {
                          boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &path_local.len_,"image/jpeg");
                        }
                        else {
                          local_1d0 = (char *)local_38;
                          local_1c8 = ext.ptr_;
                          boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (&local_1e0,".jpeg");
                          lhs_07.len_ = (size_t)local_1c8;
                          lhs_07.ptr_ = local_1d0;
                          bVar1 = boost::beast::iequals(lhs_07,local_1e0);
                          if (bVar1) {
                            boost::basic_string_view<char,_std::char_traits<char>_>::
                            basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                              &path_local.len_,"image/jpeg");
                          }
                          else {
                            local_1f0 = (char *)local_38;
                            local_1e8 = ext.ptr_;
                            boost::basic_string_view<char,_std::char_traits<char>_>::
                            basic_string_view(&local_200,".jpg");
                            lhs_06.len_ = (size_t)local_1e8;
                            lhs_06.ptr_ = local_1f0;
                            bVar1 = boost::beast::iequals(lhs_06,local_200);
                            if (bVar1) {
                              boost::basic_string_view<char,_std::char_traits<char>_>::
                              basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                                &path_local.len_,"image/jpeg");
                            }
                            else {
                              local_210 = (char *)local_38;
                              local_208 = ext.ptr_;
                              boost::basic_string_view<char,_std::char_traits<char>_>::
                              basic_string_view(&local_220,".gif");
                              lhs_05.len_ = (size_t)local_208;
                              lhs_05.ptr_ = local_210;
                              bVar1 = boost::beast::iequals(lhs_05,local_220);
                              if (bVar1) {
                                boost::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view((basic_string_view<char,_std::char_traits<char>_>
                                                   *)&path_local.len_,"image/gif");
                              }
                              else {
                                local_230 = (char *)local_38;
                                local_228 = ext.ptr_;
                                boost::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view(&local_240,".bmp");
                                lhs_04.len_ = (size_t)local_228;
                                lhs_04.ptr_ = local_230;
                                bVar1 = boost::beast::iequals(lhs_04,local_240);
                                if (bVar1) {
                                  boost::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&path_local.len_,"image/bmp");
                                }
                                else {
                                  local_250 = (char *)local_38;
                                  local_248 = ext.ptr_;
                                  boost::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view(&local_260,".ico");
                                  lhs_03.len_ = (size_t)local_248;
                                  lhs_03.ptr_ = local_250;
                                  bVar1 = boost::beast::iequals(lhs_03,local_260);
                                  if (bVar1) {
                                    boost::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&path_local.len_,"image/vnd.microsoft.icon");
                                  }
                                  else {
                                    local_270 = (char *)local_38;
                                    local_268 = ext.ptr_;
                                    boost::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_280,".tiff");
                                    lhs_02.len_ = (size_t)local_268;
                                    lhs_02.ptr_ = local_270;
                                    bVar1 = boost::beast::iequals(lhs_02,local_280);
                                    if (bVar1) {
                                      boost::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&path_local.len_,"image/tiff");
                                    }
                                    else {
                                      local_290 = (char *)local_38;
                                      local_288 = ext.ptr_;
                                      boost::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(&local_2a0,".tif");
                                      lhs_01.len_ = (size_t)local_288;
                                      lhs_01.ptr_ = local_290;
                                      bVar1 = boost::beast::iequals(lhs_01,local_2a0);
                                      if (bVar1) {
                                        boost::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&path_local.len_,"image/tiff");
                                      }
                                      else {
                                        local_2b0 = (char *)local_38;
                                        local_2a8 = ext.ptr_;
                                        boost::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view(&local_2c0,".svg");
                                        lhs_00.len_ = (size_t)local_2a8;
                                        lhs_00.ptr_ = local_2b0;
                                        bVar1 = boost::beast::iequals(lhs_00,local_2c0);
                                        if (bVar1) {
                                          boost::basic_string_view<char,_std::char_traits<char>_>::
                                          basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&path_local.len_,"image/svg+xml");
                                        }
                                        else {
                                          local_2d0 = (char *)local_38;
                                          local_2c8 = ext.ptr_;
                                          boost::basic_string_view<char,_std::char_traits<char>_>::
                                          basic_string_view(&local_2e0,".svgz");
                                          lhs.len_ = (size_t)local_2c8;
                                          lhs.ptr_ = local_2d0;
                                          bVar1 = boost::beast::iequals(lhs,local_2e0);
                                          if (bVar1) {
                                            boost::basic_string_view<char,_std::char_traits<char>_>
                                            ::basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&path_local.len_,"image/svg+xml");
                                          }
                                          else {
                                            boost::basic_string_view<char,_std::char_traits<char>_>
                                            ::basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&path_local.len_,"application/text");
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

beast::string_view
mime_type(beast::string_view path)
{
    using beast::iequals;
    auto const ext = [&path]
    {
        auto const pos = path.rfind(".");
        if(pos == beast::string_view::npos)
            return beast::string_view{};
        return path.substr(pos);
    }();
    if(iequals(ext, ".htm"))  return "text/html";
    if(iequals(ext, ".html")) return "text/html";
    if(iequals(ext, ".php"))  return "text/html";
    if(iequals(ext, ".css"))  return "text/css";
    if(iequals(ext, ".txt"))  return "text/plain";
    if(iequals(ext, ".js"))   return "application/javascript";
    if(iequals(ext, ".json")) return "application/json";
    if(iequals(ext, ".xml"))  return "application/xml";
    if(iequals(ext, ".swf"))  return "application/x-shockwave-flash";
    if(iequals(ext, ".flv"))  return "video/x-flv";
    if(iequals(ext, ".png"))  return "image/png";
    if(iequals(ext, ".jpe"))  return "image/jpeg";
    if(iequals(ext, ".jpeg")) return "image/jpeg";
    if(iequals(ext, ".jpg"))  return "image/jpeg";
    if(iequals(ext, ".gif"))  return "image/gif";
    if(iequals(ext, ".bmp"))  return "image/bmp";
    if(iequals(ext, ".ico"))  return "image/vnd.microsoft.icon";
    if(iequals(ext, ".tiff")) return "image/tiff";
    if(iequals(ext, ".tif"))  return "image/tiff";
    if(iequals(ext, ".svg"))  return "image/svg+xml";
    if(iequals(ext, ".svgz")) return "image/svg+xml";
    return "application/text";
}